

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  ModuleID value;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined8 *aValue;
  char16 *pcVar8;
  RecyclableObject *this;
  JavascriptString *pJVar9;
  undefined4 extraout_var;
  JavascriptBoolean *pJVar10;
  OpCode op;
  char16_t *pcVar11;
  RegSlot registerID;
  
  Output::Print(L"    Constant Table:\n    ======== =====\n    ");
  RVar4 = FunctionBody::GetConstantCount(dumpFunction);
  registerID = 1;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (RVar4 <= registerID) {
      Output::Print(L"\n");
      return;
    }
    DumpReg(registerID);
    aValue = (undefined8 *)FunctionBody::GetConstantVar(dumpFunction,registerID);
    if (aValue == (undefined8 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x8f,"(varConst != nullptr)","varConst != nullptr");
      if (!bVar3) goto LAB_00748234;
      *puVar7 = 0;
    }
    bVar3 = TaggedInt::Is(aValue);
    if (bVar3) {
      pcVar8 = OpCodeUtil::GetOpCodeName(LdC_A_I4);
      Output::Print(L"%-10s",pcVar8);
      value = TaggedInt::ToInt32(aValue);
LAB_00747e9b:
      DumpI4(value);
      goto LAB_00747f78;
    }
    if (aValue == &NullFrameDisplay) {
      op = LdNullDisplay;
      goto LAB_00747f62;
    }
    if (aValue == &StrictNullFrameDisplay) {
      op = LdStrictNullDisplay;
      goto LAB_00747f62;
    }
    if (aValue == (undefined8 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00748234;
      *puVar7 = 0;
    }
    bVar3 = TaggedInt::Is(aValue);
    if (bVar3) {
switchD_00748091_caseD_3:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0xe9,"((0))","Unexpected object type in DumpConstantTable");
      if (!bVar3) {
LAB_00748234:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      goto LAB_00747f78;
    }
    if ((ulong)aValue >> 0x32 != 0) {
switchD_00748091_caseD_4:
      pcVar8 = OpCodeUtil::GetOpCodeName(LdC_A_R8);
      Output::Print(L"%-10s",pcVar8);
      JavascriptNumber::GetValue(aValue);
      Output::Print(L"%G");
      goto LAB_00747f78;
    }
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00748234;
      *puVar7 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00748234;
      *puVar7 = 0;
    }
    switch(TVar1) {
    case TypeIds_Undefined:
      pcVar8 = OpCodeUtil::GetOpCodeName(Ld_A);
      Output::Print(L"%-10s",pcVar8);
      pcVar11 = L" (undefined)";
      break;
    case TypeIds_Null:
      pcVar8 = OpCodeUtil::GetOpCodeName(Ld_A);
      Output::Print(L"%-10s",pcVar8);
      pcVar11 = L" (null)";
      break;
    case TypeIds_Boolean:
      pJVar10 = VarTo<Js::JavascriptBoolean>(aValue);
      op = (ushort)(pJVar10->value == 0) * 2 + LdTrue;
      goto LAB_00747f62;
    case TypeIds_FirstNumberType:
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
    case TypeIds_Symbol:
      goto switchD_00748091_caseD_3;
    case TypeIds_Number:
      goto switchD_00748091_caseD_4;
    case TypeIds_String:
      pcVar8 = OpCodeUtil::GetOpCodeName(LdStr);
      Output::Print(L"%-10s",pcVar8);
      pJVar9 = VarTo<Js::JavascriptString>(aValue);
      iVar6 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar9);
      bVar3 = VarIs<Js::PropertyString>(aValue);
      pcVar11 = L"";
      if (bVar3) {
        pcVar11 = L" [prop]";
      }
      Output::Print(L" (\"%s\")%s",CONCAT44(extraout_var,iVar6),pcVar11);
      goto LAB_00747f78;
    case TypeIds_BigInt:
      op = BigIntLiteral;
LAB_00747f62:
      pcVar8 = OpCodeUtil::GetOpCodeName(op);
      pcVar11 = L"%-10s";
LAB_00747f6e:
      Output::Print(pcVar11,pcVar8);
      goto LAB_00747f78;
    default:
      if (TVar1 != TypeIds_ArrayLastWithES5) {
        if (TVar1 != TypeIds_GlobalObject) {
          if (TVar1 == TypeIds_LastTrueJavascriptObjectType) {
            pcVar8 = OpCodeUtil::GetOpCodeName(LdModuleRoot);
            Output::Print(L"%-10s",pcVar8);
            value = FunctionBody::GetModuleID(dumpFunction);
            goto LAB_00747e9b;
          }
          goto switchD_00748091_caseD_3;
        }
        pcVar8 = OpCodeUtil::GetOpCodeName(LdRoot);
        Output::Print(L"%-10s",pcVar8);
        goto LAB_00747f78;
      }
      Output::Print(L"%-10s",L"LdStringTemplate");
      FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
      pcVar8 = JavascriptLibrary::GetStringTemplateCallsiteObjectKey(aValue);
      pcVar11 = L" (\"%s\")";
      goto LAB_00747f6e;
    }
    Output::Print(pcVar11);
LAB_00747f78:
    Output::Print(L"\n    ");
    registerID = registerID + 1;
  } while( true );
}

Assistant:

void ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)
    {
        Output::Print(_u("    Constant Table:\n    ======== =====\n    "));
        uint count = dumpFunction->GetConstantCount();
        for (RegSlot reg = FunctionBody::FirstRegSlot; reg < count; reg++)
        {
            DumpReg(reg);
            Var varConst = dumpFunction->GetConstantVar(reg);
            Assert(varConst != nullptr);
            if (TaggedInt::Is(varConst))
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_I4));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                DumpI4(TaggedInt::ToInt32(varConst));
            }
            else if (varConst == (Js::Var)&Js::NullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (NullDisplay)"));
#endif
            }
            else if (varConst == (Js::Var)&Js::StrictNullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStrictNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (StrictNullDisplay)"));
#endif
            }
            else
            {
                switch (JavascriptOperators::GetTypeId(varConst))
                {
                case Js::TypeIds_Undefined:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (undefined)"));
                    break;
                case Js::TypeIds_Null:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (null)"));
                    break;
                case Js::TypeIds_Boolean:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(
                        VarTo<JavascriptBoolean>(varConst)->GetValue() ? OpCode::LdTrue : OpCode::LdFalse));
                    break;
                case Js::TypeIds_Number:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_R8));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u("%G"), JavascriptNumber::GetValue(varConst));
                    break;
                case Js::TypeIds_BigInt:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::BigIntLiteral));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_String:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStr));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u(" (\"%s\")%s"), VarTo<JavascriptString>(varConst)->GetSz(), Js::VarIs<Js::PropertyString>(varConst) ? _u(" [prop]") : _u(""));
                    break;
                case Js::TypeIds_GlobalObject:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_ModuleRoot:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdModuleRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    DumpI4(dumpFunction->GetModuleID());
                    break;
                case Js::TypeIds_ES5Array:
                    // ES5Array objects in the constant table are always string template callsite objects.
                    // If we later put other ES5Array objects in the constant table, we'll need another way
                    // to decide the constant type.
                    Output::Print(_u("%-10s"), _u("LdStringTemplate"));
                    Output::Print(_u(" (\"%s\")"), dumpFunction->GetScriptContext()->GetLibrary()->GetStringTemplateCallsiteObjectKey(varConst));
                    break;
                default:
                    AssertMsg(UNREACHED, "Unexpected object type in DumpConstantTable");
                    break;
                }
            }
            Output::Print(_u("\n    "));
        }
        Output::Print(_u("\n"));
    }